

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O3

void waitForReaderResponseAndSendQueued(WS_ReaderInfo Reader)

{
  pthread_mutex_t *__mutex;
  SstStream s;
  bool bVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  ssize_t sVar4;
  long lVar5;
  CPTimestepList Entry;
  
  s = Reader->ParentStream;
  __mutex = &s->DataLock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  while (Reader->ReaderStatus == Opening) {
    _Var2 = getpid();
    pVar3 = pthread_self();
    CP_verbose(s,PerRankVerbose,"(PID %lx, TID %lx) Waiting for Reader ready on WSR %p.\n",
               (long)_Var2,pVar3,Reader);
    pthread_cond_wait((pthread_cond_t *)&s->DataCondition,(pthread_mutex_t *)__mutex);
  }
  if (Reader->ReaderStatus != Established) {
    CP_verbose(s,CriticalVerbose,"Reader WSR %p, Failed during startup.\n",Reader);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  Reader->OldestUnreleasedTimestep = Reader->StartingTimestep;
  CP_verbose(s,PerStepVerbose,
             "Reader ready on WSR %p, Stream established, Starting %ld LastProvided %ld.\n",Reader,
             Reader->StartingTimestep,s->LastProvidedTimestep);
  if (s->ConfigParams->StepDistributionMode == 0) {
    lVar5 = Reader->StartingTimestep;
    sVar4 = s->LastProvidedTimestep;
    if (lVar5 <= sVar4) {
      do {
        Entry = s->QueuedTimesteps;
        if (Entry != (CPTimestepList)0x0) {
          do {
            CP_verbose(s,TraceVerbose,"In send queued, trying to send TS %ld, examining TS %ld\n",
                       lVar5,Entry->Timestep);
            if (Reader->ReaderStatus != Established) break;
            if (Entry->Timestep == lVar5) {
              if ((Entry->Expired == 0) || (Entry->PreciousTimestep != 0)) {
                CP_verbose(s,PerStepVerbose,
                           "Sending Queued TimestepMetadata for timestep %ld, reference count = %d\n"
                           ,lVar5,(ulong)(uint)Entry->ReferenceCount);
                SendTimestepEntryToSingleReader(s,Entry,Reader,-1);
              }
              else {
                CP_verbose(s,TraceVerbose,
                           "Reader send queued skipping  TS %ld, expired and not precious\n",lVar5,
                           lVar5);
              }
            }
            Entry = Entry->Next;
          } while (Entry != (_CPTimestepEntry *)0x0);
          sVar4 = s->LastProvidedTimestep;
        }
        bVar1 = lVar5 < sVar4;
        lVar5 = lVar5 + 1;
      } while (bVar1);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

static void waitForReaderResponseAndSendQueued(WS_ReaderInfo Reader)
{
    SstStream Stream = Reader->ParentStream;
    STREAM_MUTEX_LOCK(Stream);
    while (Reader->ReaderStatus == Opening)
    {
        CP_verbose(Stream, PerRankVerbose,
                   "(PID %lx, TID %lx) Waiting for Reader ready on WSR %p.\n", (long)getpid(),
                   (long)gettid(), Reader);
        STREAM_CONDITION_WAIT(Stream);
    }

    if (Reader->ReaderStatus != Established)
    {
        CP_verbose(Stream, CriticalVerbose, "Reader WSR %p, Failed during startup.\n",
                   (void *)Reader);
        STREAM_MUTEX_UNLOCK(Stream);
    }
    /* LOCK */
    /* LastReleased is set to OldestItemTS - 1 */
    /* foreach item in queue */
    /*       if (reader is established) */
    /*           if TS is expired CONTINUE */
    /*          increment TS reference count */
    /* 	 update readers LastSent */
    /*          UNLOCK */
    /*          write event to reader (might cause connection closed) */
    /*          LOCK */
    /*       } */
    /*    } */
    /* } */
    /* UNLOCK */

    /* send any queued metadata necessary */
    Reader->OldestUnreleasedTimestep = Reader->StartingTimestep;
    CP_verbose(Stream, PerStepVerbose,
               "Reader ready on WSR %p, Stream established, Starting %ld "
               "LastProvided %ld.\n",
               Reader, Reader->StartingTimestep, Stream->LastProvidedTimestep);
    if (Stream->ConfigParams->StepDistributionMode == StepsAllToAll)
    {
        for (ssize_t TS = Reader->StartingTimestep; TS <= Stream->LastProvidedTimestep; TS++)
        {
            CPTimestepList List = Stream->QueuedTimesteps;
            while (List)
            {
                CP_verbose(Stream, TraceVerbose,
                           "In send queued, trying to send TS %ld, examining TS %ld\n", TS,
                           List->Timestep);
                if (Reader->ReaderStatus != Established)
                {
                    break; /* break out of while if we've fallen out of
                            * established
                            */
                }
                if (List->Timestep == TS)
                {
                    if (List->Expired && !List->PreciousTimestep)
                    {
                        CP_verbose(Stream, TraceVerbose,
                                   "Reader send queued skipping  TS %ld, expired "
                                   "and not precious\n",
                                   List->Timestep, TS);
                        List = List->Next;
                        continue; /* skip timestep is expired, but not
                                     precious */
                    }
                    CP_verbose(Stream, PerStepVerbose,
                               "Sending Queued TimestepMetadata for timestep %ld, "
                               "reference count = %d\n",
                               TS, List->ReferenceCount);

                    SendTimestepEntryToSingleReader(Stream, List, Reader, -1);
                }
                List = List->Next;
            }
        }
    }
    STREAM_MUTEX_UNLOCK(Stream);
}